

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedralBuilderCmd.cpp
# Opt level: O3

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  ulong uVar1;
  
  if (args_info->output_arg != (char *)0x0) {
    free(args_info->output_arg);
    args_info->output_arg = (char *)0x0;
  }
  if (args_info->output_orig != (char *)0x0) {
    free(args_info->output_orig);
    args_info->output_orig = (char *)0x0;
  }
  if (args_info->shells_orig != (char *)0x0) {
    free(args_info->shells_orig);
    args_info->shells_orig = (char *)0x0;
  }
  if (args_info->latticeConstant_orig != (char *)0x0) {
    free(args_info->latticeConstant_orig);
    args_info->latticeConstant_orig = (char *)0x0;
  }
  if (args_info->lattice_arg != (char *)0x0) {
    free(args_info->lattice_arg);
    args_info->lattice_arg = (char *)0x0;
  }
  if (args_info->lattice_orig != (char *)0x0) {
    free(args_info->lattice_orig);
    args_info->lattice_orig = (char *)0x0;
  }
  if (args_info->columnAtoms_orig != (char *)0x0) {
    free(args_info->columnAtoms_orig);
    args_info->columnAtoms_orig = (char *)0x0;
  }
  if (args_info->twinAtoms_orig != (char *)0x0) {
    free(args_info->twinAtoms_orig);
    args_info->twinAtoms_orig = (char *)0x0;
  }
  if (args_info->truncatedPlanes_orig != (char *)0x0) {
    free(args_info->truncatedPlanes_orig);
    args_info->truncatedPlanes_orig = (char *)0x0;
  }
  if (args_info->unitCells_orig != (char *)0x0) {
    free(args_info->unitCells_orig);
    args_info->unitCells_orig = (char *)0x0;
  }
  if (args_info->inputs_num != 0) {
    uVar1 = 0;
    do {
      free(args_info->inputs[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < args_info->inputs_num);
    if (args_info->inputs_num != 0) {
      free(args_info->inputs);
    }
  }
  args_info->clusterShape_group_counter = 0;
  args_info->help_given = 0;
  args_info->version_given = 0;
  args_info->output_given = 0;
  args_info->shells_given = 0;
  args_info->latticeConstant_given = 0;
  args_info->lattice_given = 0;
  args_info->columnAtoms_given = 0;
  args_info->twinAtoms_given = 0;
  args_info->truncatedPlanes_given = 0;
  args_info->unitCells_given = 0;
  args_info->ico_given = 0;
  args_info->deca_given = 0;
  args_info->ino_given = 0;
  args_info->marks_given = 0;
  args_info->stone_given = 0;
  args_info->cuboctahedron_given = 0;
  args_info->truncatedCube_given = 0;
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->shells_orig));
  free_string_field (&(args_info->latticeConstant_orig));
  free_string_field (&(args_info->lattice_arg));
  free_string_field (&(args_info->lattice_orig));
  free_string_field (&(args_info->columnAtoms_orig));
  free_string_field (&(args_info->twinAtoms_orig));
  free_string_field (&(args_info->truncatedPlanes_orig));
  free_string_field (&(args_info->unitCells_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}